

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.hpp
# Opt level: O1

void __thiscall
yactfr::internal::PktProcBuilder::
_buildReadVarInstr<yactfr::internal::BeginReadVarSIntSelInstr,yactfr::VariantWithSignedIntegerSelectorType>
          (PktProcBuilder *this,StructureMemberType *memberType,
          VariantWithSignedIntegerSelectorType *varType,Proc *baseProc,Kind endInstrKind)

{
  bool bVar1;
  pointer puVar2;
  socklen_t *__addr_len;
  Proc *this_00;
  socklen_t *psVar3;
  shared_ptr<yactfr::internal::BeginReadVarSIntSelInstr> instr;
  shared_ptr<yactfr::internal::EndReadDataInstr> endInstr;
  undefined1 local_95;
  Kind local_94;
  element_type *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_88;
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_78;
  undefined8 local_70;
  Proc *local_68;
  Proc *local_60;
  shared_ptr<yactfr::internal::Instr> local_58;
  StructureMemberType *local_48;
  shared_ptr<yactfr::internal::Instr> local_40;
  
  local_90 = (element_type *)0x0;
  local_94 = endInstrKind;
  local_60 = baseProc;
  local_48 = memberType;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<yactfr::internal::BeginReadVarSIntSelInstr,std::allocator<yactfr::internal::BeginReadVarSIntSelInstr>,yactfr::StructureMemberType_const*const&,yactfr::VariantWithSignedIntegerSelectorType_const&>
            (&_Stack_88,(BeginReadVarSIntSelInstr **)&local_90,
             (allocator<yactfr::internal::BeginReadVarSIntSelInstr> *)&local_80,&local_48,varType);
  puVar2 = (varType->super_VariantWithIntegerSelectorType<long_long>)._opts.
           super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((varType->super_VariantWithIntegerSelectorType<long_long>)._opts.
      super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    __addr_len = (socklen_t *)0x0;
    psVar3 = (socklen_t *)0x1;
    do {
      this_00 = (Proc *)((long)*(sockaddr **)&local_90[2]._theKind + (long)__addr_len * 0x38 + 8);
      local_80 = (element_type *)&PTR__DataTypeVisitor_00303828;
      local_70 = 0;
      _Stack_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
      local_68 = this_00;
      DataType::accept((DataType *)
                       ((puVar2[(long)__addr_len]._M_t.
                         super___uniq_ptr_impl<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_const_yactfr::VariantTypeOption<long_long>_*,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>
                         .super__Head_base<0UL,_const_yactfr::VariantTypeOption<long_long>_*,_false>
                        ._M_head_impl)->_dt)._M_t.
                       super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>
                       ,(int)&local_80,*(sockaddr **)&local_90[2]._theKind,__addr_len);
      local_80 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<yactfr::internal::EndReadDataInstr,std::allocator<yactfr::internal::EndReadDataInstr>,yactfr::internal::Instr::Kind_const&,yactfr::StructureMemberType_const*const&,yactfr::VariantWithSignedIntegerSelectorType_const&>
                (&_Stack_78,(EndReadDataInstr **)&local_80,
                 (allocator<yactfr::internal::EndReadDataInstr> *)&local_95,&local_94,&local_48,
                 varType);
      local_58.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_80;
      local_58.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Stack_78._M_pi;
      local_80 = (element_type *)0x0;
      _Stack_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Proc::pushBack(this_00,&local_58);
      if (local_58.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (_Stack_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_78._M_pi);
      }
      puVar2 = (varType->super_VariantWithIntegerSelectorType<long_long>)._opts.
               super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = psVar3 < (socklen_t *)
                       ((long)(varType->super_VariantWithIntegerSelectorType<long_long>)._opts.
                              super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3);
      __addr_len = psVar3;
      psVar3 = (socklen_t *)(ulong)((int)psVar3 + 1);
    } while (bVar1);
  }
  local_40.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_90
  ;
  local_40.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_88._M_pi;
  local_90 = (element_type *)0x0;
  _Stack_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Proc::pushBack(local_60,&local_40);
  if (local_40.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_88._M_pi);
  }
  return;
}

Assistant:

void PktProcBuilder::_buildReadVarInstr(const StructureMemberType * const memberType,
                                        const VarTypeT& varType, Proc& baseProc,
                                        const Instr::Kind endInstrKind)
{
    auto instr = std::make_shared<BeginReadVarInstrT>(memberType, varType);

    for (auto i = 0U; i < varType.size(); ++i) {
        auto& optProc = instr->opts()[i].proc();

        this->_buildReadInstr(nullptr, varType[i].dataType(), optProc);

        /*
         * The VM can push the procedure of each option as the current
         * one, so each one ends with an "end read variant" instruction
         * to be consistent with other begin/end instruction pairs.
         */
        auto endInstr = std::make_shared<EndReadDataInstr>(endInstrKind, memberType, varType);

        optProc.pushBack(std::move(endInstr));
    }

    baseProc.pushBack(std::move(instr));
}